

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O1

int __thiscall ncnn::InnerProduct_x86::create_pipeline(InnerProduct_x86 *this,Option *opt)

{
  uint uVar1;
  int iVar2;
  _func_int *p_Var3;
  _func_int **pp_Var4;
  void *pvVar5;
  size_t sVar6;
  Allocator *pAVar7;
  int *piVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  Layer *pLVar13;
  undefined4 *puVar14;
  undefined4 *puVar15;
  undefined4 *puVar16;
  long lVar17;
  undefined4 *puVar18;
  ulong uVar19;
  ulong uVar20;
  ParamDict pd;
  Mat local_78;
  
  pLVar13 = create_layer(0xe);
  this->flatten = pLVar13;
  ParamDict::ParamDict((ParamDict *)&local_78);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_78);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_78);
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x140 + (long)this->_vptr_InnerProduct_x86[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    iVar12 = cpu_support_x86_f16c();
    if ((iVar12 == 0) || (opt->use_fp16_storage != true)) {
      p_Var3 = this->_vptr_InnerProduct_x86[-3];
      uVar1 = *(uint *)(&this->field_0xd0 + (long)p_Var3);
      iVar12 = *(int *)(&this->field_0xd8 + (long)p_Var3);
      uVar9 = (long)iVar12 / (long)(int)uVar1;
      if (((uVar1 & 3) == 0 & opt->use_packing_layout) == 1) {
        iVar12 = (int)uVar9;
        Mat::reshape(&local_78,(Mat *)(&this->field_0x130 + (long)this->_vptr_InnerProduct_x86[-3]),
                     iVar12,((Mat *)(&this->field_0x130 + (long)this->_vptr_InnerProduct_x86[-3]))
                            [-2].h,(Allocator *)0x0);
        Mat::create(&this->weight_data_tm,iVar12,
                    *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]) / 4,0x10,4,
                    (Allocator *)0x0);
        pp_Var4 = this->_vptr_InnerProduct_x86;
        if (3 < *(int *)(&this->field_0xd0 + (long)pp_Var4[-3])) {
          pvVar5 = (this->weight_data_tm).data;
          iVar2 = (this->weight_data_tm).w;
          sVar6 = (this->weight_data_tm).elemsize;
          puVar15 = (undefined4 *)local_78.data;
          uVar19 = 0;
          do {
            if (0 < iVar12) {
              puVar18 = (undefined4 *)
                        ((uVar19 >> 2 & 0x3fffffff) * (long)iVar2 * sVar6 + (long)pvVar5);
              uVar20 = 0;
              puVar14 = puVar15;
              lVar17 = 4;
              puVar16 = puVar15;
              do {
                do {
                  *puVar18 = *puVar14;
                  puVar18 = puVar18 + 1;
                  lVar17 = lVar17 + -1;
                  puVar14 = (undefined4 *)((long)puVar14 + (long)local_78.w * local_78.elemsize);
                } while (lVar17 != 0);
                uVar20 = uVar20 + 1;
                puVar14 = puVar16 + 1;
                lVar17 = 4;
                puVar16 = puVar14;
              } while (uVar20 != (uVar9 & 0xffffffff));
            }
            lVar17 = uVar19 + 7;
            puVar15 = puVar15 + (long)local_78.w * local_78.elemsize;
            uVar19 = uVar19 + 4;
          } while (lVar17 < *(int *)(&this->field_0xd0 + (long)pp_Var4[-3]));
        }
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + -1;
          UNLOCK();
          if (*local_78.refcount == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if ((undefined4 *)local_78.data != (undefined4 *)0x0) {
                free(local_78.data);
              }
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else if (p_Var3 != (_func_int *)0xfffffffffffffee0) {
        piVar8 = *(int **)(&this->field_0x138 + (long)p_Var3);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        piVar8 = (this->weight_data_tm).refcount;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            pvVar5 = (this->weight_data_tm).data;
            pAVar7 = (this->weight_data_tm).allocator;
            if (pAVar7 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (*pAVar7->_vptr_Allocator[3])
                        (pAVar7,pvVar5,(long)iVar12 % (long)(int)uVar1 & 0xffffffff);
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
        (this->weight_data_tm).data = (void *)0x0;
        (this->weight_data_tm).refcount = (int *)0x0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        (this->weight_data_tm).c = 0;
        piVar8 = *(int **)((long)(&this->field_0x130 + (long)p_Var3) + 8);
        (this->weight_data_tm).data = *(void **)(&this->field_0x130 + (long)p_Var3);
        (this->weight_data_tm).refcount = piVar8;
        (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x140 + (long)p_Var3);
        (this->weight_data_tm).elempack = *(int *)(&this->field_0x148 + (long)p_Var3);
        (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x150 + (long)p_Var3);
        uVar10 = *(undefined8 *)(&this->field_0x158 + (long)p_Var3);
        uVar11 = *(undefined8 *)((long)(&this->field_0x158 + (long)p_Var3) + 8);
        (this->weight_data_tm).dims = (int)uVar10;
        (this->weight_data_tm).w = (int)((ulong)uVar10 >> 0x20);
        (this->weight_data_tm).h = (int)uVar11;
        (this->weight_data_tm).d = (int)((ulong)uVar11 >> 0x20);
        (this->weight_data_tm).c = *(int *)(&this->field_0x168 + (long)p_Var3);
        (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x170 + (long)p_Var3);
      }
      if (opt->lightmode == true) {
        p_Var3 = this->_vptr_InnerProduct_x86[-3];
        piVar8 = *(int **)(&this->field_0x138 + (long)p_Var3);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (*(long **)(&this->field_0x150 + (long)p_Var3) == (long *)0x0) {
              if (*(void **)(&this->field_0x130 + (long)p_Var3) != (void *)0x0) {
                free(*(void **)(&this->field_0x130 + (long)p_Var3));
              }
            }
            else {
              (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var3) + 0x18))();
            }
          }
        }
        *(undefined8 *)(&this->field_0x170 + (long)p_Var3) = 0;
        *(undefined8 *)(&this->field_0x13c + (long)p_Var3) = 0;
        *(undefined8 *)(&this->field_0x144 + (long)p_Var3) = 0;
        *(undefined8 *)(&this->field_0x130 + (long)p_Var3) = 0;
        *(undefined8 *)(&this->field_0x138 + (long)p_Var3) = 0;
        *(undefined8 *)(&this->field_0x158 + (long)p_Var3) = 0;
        *(undefined8 *)(&this->field_0x160 + (long)p_Var3) = 0;
        *(undefined4 *)(&this->field_0x168 + (long)p_Var3) = 0;
      }
    }
    else {
      create_pipeline_fp16s(this,opt);
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (out_elempack != 1)
    {
        // src = inch-outch
        // dst = pb-inch-outch/pb
        {
            Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

            weight_data_tm.create(num_input, num_output / out_elempack, (size_t)4u * out_elempack, out_elempack);

            for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
            {
                float* g0 = weight_data_tm.row(q / out_elempack);

                for (int p = 0; p < num_input; p++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        *g0++ = weight_data_r2.row(q + j)[p];
                    }
                }
            }
        }
    }
    else
    {
        weight_data_tm = weight_data;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}